

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

void __thiscall
t_c_glib_generator::generate_deserialize_set_element
          (t_c_glib_generator *this,ostream *out,t_set *tset,string *prefix,int error_ret)

{
  int *piVar1;
  t_type *ttype;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator local_19a;
  allocator local_199;
  string elem;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string telem_ptr;
  string local_f8;
  t_field felem;
  
  ttype = tset->elem_type_;
  std::__cxx11::string::string((string *)&local_f8,"_elem",(allocator *)&felem);
  t_generator::tmp(&elem,(t_generator *)this,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[6])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
    pcVar4 = "";
    if ((char)iVar2 != '\0') {
      pcVar4 = "*";
    }
  }
  else {
    pcVar4 = "";
  }
  std::__cxx11::string::string((string *)&telem_ptr,pcVar4,(allocator *)&felem);
  declare_local_variable(this,out,ttype,&elem,true);
  std::operator+(&local_138,&telem_ptr,&elem);
  t_field::t_field(&felem,ttype,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string((string *)&local_158,"",&local_199);
  std::__cxx11::string::string((string *)&local_178,"",&local_19a);
  generate_deserialize_field(this,out,&felem,&local_158,&local_178,error_ret,true);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"if (");
  poVar3 = std::operator<<(poVar3,(string *)prefix);
  poVar3 = std::operator<<(poVar3," && ");
  poVar3 = std::operator<<(poVar3,(string *)&elem);
  poVar3 = std::operator<<(poVar3,")");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"g_hash_table_insert ((GHashTable *) ");
  poVar3 = std::operator<<(poVar3,(string *)prefix);
  poVar3 = std::operator<<(poVar3,", (gpointer) ");
  poVar3 = std::operator<<(poVar3,(string *)&elem);
  poVar3 = std::operator<<(poVar3,", (gpointer) ");
  poVar3 = std::operator<<(poVar3,(string *)&elem);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_field::~t_field(&felem);
  std::__cxx11::string::~string((string *)&telem_ptr);
  std::__cxx11::string::~string((string *)&elem);
  return;
}

Assistant:

void t_c_glib_generator::generate_deserialize_set_element(ostream& out,
                                                          t_set* tset,
                                                          string prefix,
                                                          int error_ret) {
  t_type* telem = tset->get_elem_type();
  string elem = tmp("_elem");
  string telem_ptr = telem->is_string() || !telem->is_base_type() ? "" : "*";

  declare_local_variable(out, telem, elem, true);

  t_field felem(telem, telem_ptr + elem);
  generate_deserialize_field(out, &felem, "", "", error_ret);

  indent(out) << "if (" << prefix << " && " << elem << ")" << endl;
  indent_up();
  indent(out) << "g_hash_table_insert ((GHashTable *) " << prefix << ", (gpointer) " << elem
              << ", (gpointer) " << elem << ");" << endl;
  indent_down();
}